

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

SAttribute * __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::getAttributeByName
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this,unsigned_short *name)

{
  SAttribute *pSVar1;
  unsigned_short *puVar2;
  long lVar3;
  SAttribute *pSVar4;
  long lVar5;
  unsigned_short uVar6;
  long lVar7;
  string<unsigned_short> n;
  string<unsigned_short> local_28;
  
  if (name == (unsigned_short *)0x0) {
    pSVar4 = (SAttribute *)0x0;
  }
  else {
    local_28.array = (unsigned_short *)0x0;
    local_28.allocated = 0;
    local_28.used = 0;
    core::string<unsigned_short>::operator=(&local_28,name);
    lVar3 = (long)(int)(this->Attributes).used;
    if (0 < lVar3) {
      pSVar1 = (this->Attributes).data;
      lVar5 = 0;
      do {
        puVar2 = pSVar1[lVar5].Name.array;
        uVar6 = *puVar2;
        if (uVar6 != 0) {
          lVar7 = 0;
          do {
            if (*(unsigned_short *)((long)local_28.array + lVar7) == 0) break;
            if (uVar6 != *(unsigned_short *)((long)local_28.array + lVar7)) goto LAB_00732960;
            uVar6 = *(unsigned_short *)((long)puVar2 + lVar7 + 2);
            lVar7 = lVar7 + 2;
          } while (uVar6 != 0);
        }
        pSVar4 = pSVar1 + lVar5;
        if ((pSVar4->Name).used == local_28.used) goto LAB_0073296a;
LAB_00732960:
        lVar5 = lVar5 + 1;
      } while (lVar5 != lVar3);
    }
    pSVar4 = (SAttribute *)0x0;
LAB_0073296a:
    if (local_28.array != (unsigned_short *)0x0) {
      operator_delete__(local_28.array);
    }
  }
  return pSVar4;
}

Assistant:

const SAttribute* getAttributeByName(const char_type* name) const
	{
		if (!name)
			return 0;

		core::string<char_type> n = name;

		for (int i=0; i<(int)Attributes.size(); ++i)
			if (Attributes[i].Name == n)
				return &Attributes[i];

		return 0;
	}